

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_vec2 nk_window_get_content_region_min(nk_context *ctx)

{
  nk_panel *pnVar1;
  nk_vec2 nVar2;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x400b,"struct nk_vec2 nk_window_get_content_region_min(struct nk_context *)");
  }
  if (ctx->current != (nk_window *)0x0) {
    pnVar1 = ctx->current->layout;
    if (pnVar1 != (nk_panel *)0x0) {
      nVar2.x = (pnVar1->clip).x;
      nVar2.y = (pnVar1->clip).y;
      return nVar2;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x400d,"struct nk_vec2 nk_window_get_content_region_min(struct nk_context *)");
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                ,0x400c,"struct nk_vec2 nk_window_get_content_region_min(struct nk_context *)");
}

Assistant:

NK_API struct nk_vec2
nk_window_get_content_region_min(struct nk_context *ctx)
{
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current) return nk_vec2(0,0);
    return nk_vec2(ctx->current->layout->clip.x, ctx->current->layout->clip.y);
}